

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Generator.cpp
# Opt level: O1

EStatusCode __thiscall MD5Generator::Accumulate(MD5Generator *this,ByteList *inString)

{
  ulong inBlockSize;
  _List_node_base *p_Var1;
  EStatusCode EVar2;
  uint1 *inBlock;
  uint1 *puVar3;
  
  EVar2 = eFailure;
  if (this->mIsFinalized == false) {
    inBlockSize = (inString->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl._M_node._M_size;
    inBlock = (uint1 *)operator_new__(inBlockSize);
    puVar3 = inBlock;
    for (p_Var1 = (inString->super__List_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl._M_node.super__List_node_base._M_next;
        p_Var1 != (_List_node_base *)inString;
        p_Var1 = (((_List_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var1->_M_next)->
                 _M_impl)._M_node.super__List_node_base._M_next) {
      *puVar3 = *(uint1 *)&p_Var1[1]._M_next;
      puVar3 = puVar3 + 1;
    }
    _Accumulate(this,inBlock,inBlockSize);
    operator_delete__(inBlock);
    EVar2 = eSuccess;
  }
  return EVar2;
}

Assistant:

EStatusCode MD5Generator::Accumulate(const ByteList& inString)
{
	if(mIsFinalized)
		return PDFHummus::eFailure;

	Byte* buffer = new Byte[inString.size()];
	Byte* itBuffer = buffer;
	ByteList::const_iterator it = inString.begin();
	for (; it != inString.end(); ++it,++itBuffer)
		*itBuffer = *it;
	
	_Accumulate((const uint1*)buffer,(unsigned long)inString.size());
	delete[] buffer;
	return PDFHummus::eSuccess;

}